

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingTest.cpp
# Opt level: O0

void other(void)

{
  ostream *this;
  LogStream *pLVar1;
  allocator local_1011;
  string local_1010 [48];
  Logger local_fe0;
  
  this = std::operator<<((ostream *)&std::cout,"----------other test-----------");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  tt::Logger::Logger(&local_fe0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HhTtLllL[P]web_server/h_webserver/base/tests/LoggingTest.cpp"
                     ,0x49);
  pLVar1 = tt::Logger::stream(&local_fe0);
  pLVar1 = tt::LogStream::operator<<(pLVar1,"fddsa");
  pLVar1 = tt::LogStream::operator<<(pLVar1,'c');
  pLVar1 = tt::LogStream::operator<<(pLVar1,0);
  pLVar1 = tt::LogStream::operator<<(pLVar1,3.666);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1010,"This is a string",&local_1011);
  tt::LogStream::operator<<(pLVar1,(string *)local_1010);
  std::__cxx11::string::~string(local_1010);
  std::allocator<char>::~allocator((allocator<char> *)&local_1011);
  tt::Logger::~Logger(&local_fe0);
  return;
}

Assistant:

void other()
{
    // 1 line
    cout << "----------other test-----------" << endl;
    LOG << "fddsa" << 'c' << 0 << 3.666 << string("This is a string");
}